

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O3

void __thiscall cmOrderDirectories::DiagnoseCycle(cmOrderDirectories *this)

{
  pointer pbVar1;
  pointer ppVar2;
  cmOrderDirectoriesConstraint *pcVar3;
  cmake *this_00;
  ostream *poVar4;
  string *psVar5;
  ulong uVar6;
  ConflictPair *j;
  pointer ppVar7;
  ulong uVar8;
  ostringstream e;
  pointer local_1e8;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [376];
  
  if (this->CycleDiagnosed == false) {
    this->CycleDiagnosed = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot generate a safe ",0x17);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(this->Purpose)._M_dataplus._M_p,
                        (this->Purpose)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," for target ",0xc);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," because there is a cycle in the constraint graph:\n",0x33);
    local_1e8 = (this->ConflictGraph).
                super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if ((this->ConflictGraph).
        super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
        ._M_impl.super__Vector_impl_data._M_finish != local_1e8) {
      uVar8 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  dir ",6);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," is [",5);
        pbVar1 = (this->OriginalDirectories).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,pbVar1[uVar8]._M_dataplus._M_p,pbVar1[uVar8]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
        ppVar2 = local_1e8[uVar8].
                 super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (ppVar7 = local_1e8[uVar8].
                      super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2;
            ppVar7 = ppVar7 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    dir ",8);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,ppVar7->first);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," must precede it due to ",0x18)
          ;
          pcVar3 = (this->ConstraintEntries).
                   super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[ppVar7->second];
          (*pcVar3->_vptr_cmOrderDirectoriesConstraint[2])(pcVar3,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        }
        uVar8 = (ulong)((int)uVar8 + 1);
        local_1e8 = (this->ConflictGraph).
                    super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        uVar6 = ((long)(this->ConflictGraph).
                       super__Vector_base<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)local_1e8 >> 3) *
                -0x5555555555555555;
      } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Some of these libraries may not be found correctly.",0x33);
    this_00 = this->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d8);
    cmake::IssueMessage(this_00,WARNING,(string *)(local_1d8 + 0x10),
                        (cmListFileBacktrace *)local_1d8);
    if ((cmMakefile *)local_1d8._8_8_ != (cmMakefile *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._16_8_ != &local_1b8) {
      operator_delete((void *)local_1d8._16_8_,(ulong)(local_1b8._M_allocated_capacity + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return;
}

Assistant:

void cmOrderDirectories::DiagnoseCycle()
{
  // Report the cycle at most once.
  if (this->CycleDiagnosed) {
    return;
  }
  this->CycleDiagnosed = true;

  // Construct the message.
  std::ostringstream e;
  e << "Cannot generate a safe " << this->Purpose << " for target "
    << this->Target->GetName()
    << " because there is a cycle in the constraint graph:\n";

  // Display the conflict graph.
  for (unsigned int i = 0; i < this->ConflictGraph.size(); ++i) {
    ConflictList const& clist = this->ConflictGraph[i];
    e << "  dir " << i << " is [" << this->OriginalDirectories[i] << "]\n";
    for (ConflictPair const& j : clist) {
      e << "    dir " << j.first << " must precede it due to ";
      this->ConstraintEntries[j.second]->Report(e);
      e << "\n";
    }
  }
  e << "Some of these libraries may not be found correctly.";
  this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
    MessageType::WARNING, e.str(), this->Target->GetBacktrace());
}